

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# afcjk.c
# Opt level: O1

FT_Error af_cjk_metrics_init(AF_CJKMetrics metrics,FT_Face face)

{
  ushort uVar1;
  AF_Blue_Stringset AVar2;
  FT_CharMap pFVar3;
  FT_GlyphSlot pFVar4;
  FT_Vector *pFVar5;
  bool bVar6;
  FT_Error FVar7;
  AF_Blue_String AVar8;
  uint uVar9;
  AF_CJKBlueRec *pAVar10;
  AF_Blue_StringRec *pAVar11;
  long lVar12;
  ulong uVar13;
  long lVar14;
  uint uVar15;
  ulong uVar16;
  byte bVar17;
  AF_CJKMetrics face_00;
  long lVar19;
  int iVar20;
  int iVar21;
  int iVar22;
  long lVar23;
  FT_Pos *pFVar24;
  FT_Vector *pFVar25;
  char *p;
  FT_ULong shaper_buf_;
  FT_Pos flats [51];
  FT_Pos fills [51];
  ulong local_3b8;
  uint local_3ac;
  AF_CJKMetrics local_3a8;
  FT_Face local_3a0;
  FT_CharMap local_398;
  AF_CJKAxisRec *local_390;
  AF_CJKAxisRec *local_388;
  AF_CJKAxisRec *local_380;
  AF_Blue_StringRec *local_378;
  AF_CJKMetrics local_370;
  long alStack_368 [52];
  long alStack_1c8 [51];
  undefined7 uVar18;
  
  pFVar3 = face->charmap;
  metrics->units_per_em = (uint)face->units_per_EM;
  FVar7 = FT_Select_Charmap(face,FT_ENCODING_UNICODE);
  local_398 = pFVar3;
  if (FVar7 == 0) {
    face_00 = (AF_CJKMetrics)face;
    af_cjk_metrics_init_widths(metrics,face);
    AVar2 = ((metrics->root).style_class)->blue_stringset;
    AVar8 = af_blue_stringsets[AVar2].string;
    if (AVar8 != AF_BLUE_STRING_MAX) {
      pAVar11 = af_blue_stringsets + AVar2;
      local_388 = metrics->axis;
      local_390 = metrics->axis + 1;
      local_3a8 = metrics;
      local_3a0 = face;
      do {
        uVar1 = pAVar11->properties;
        local_380 = local_388;
        if ((uVar1 & 2) == 0) {
          local_380 = local_390;
        }
        local_3b8._0_4_ = 0;
        uVar15 = 0;
        local_378 = pAVar11;
        if (af_blue_strings[AVar8] != '\0') {
          p = af_blue_strings + AVar8;
          bVar6 = true;
          uVar16 = 0;
          local_3b8 = 0;
          do {
            for (; *p == ' '; p = p + 1) {
            }
            if (*p == '|') {
              p = p + 1;
              bVar6 = false;
            }
            else {
              face_00 = metrics;
              p = af_shaper_get_cluster(p,&metrics->root,&local_370,&local_3ac);
              if ((((local_3ac < 2) && (face_00 = local_370, local_370 != (AF_CJKMetrics)0x0)) &&
                  (FVar7 = FT_Load_Glyph(face,(FT_UInt)local_370,1), FVar7 == 0)) &&
                 (pFVar4 = face->glyph, 2 < (pFVar4->outline).n_points)) {
                lVar14 = (long)(pFVar4->outline).n_contours;
                if (lVar14 < 1) {
                  lVar12 = 0;
                }
                else {
                  pFVar5 = (pFVar4->outline).points;
                  face_00 = (AF_CJKMetrics)(pFVar4->outline).contours;
                  iVar20 = -1;
                  lVar19 = 0;
                  iVar21 = 0;
                  lVar12 = 0;
                  do {
                    iVar22 = (int)*(short *)((long)face_00->axis[0].widths + lVar19 * 2 + -0x68);
                    if (iVar21 < iVar22) {
                      lVar23 = (long)iVar21;
                      if ((uVar1 & 2) == 0) {
                        pFVar24 = &pFVar5[lVar23].y;
                        lVar23 = (iVar22 - lVar23) + 1;
                        if ((uVar1 & 1) == 0) {
                          do {
                            if ((iVar20 < 0) || (*pFVar24 < lVar12)) {
                              lVar12 = *pFVar24;
                              iVar20 = iVar21;
                            }
                            iVar21 = iVar21 + 1;
                            pFVar24 = pFVar24 + 2;
                            lVar23 = lVar23 + -1;
                          } while (lVar23 != 0);
                        }
                        else {
                          do {
                            if ((iVar20 < 0) || (lVar12 < *pFVar24)) {
                              lVar12 = *pFVar24;
                              iVar20 = iVar21;
                            }
                            iVar21 = iVar21 + 1;
                            pFVar24 = pFVar24 + 2;
                            lVar23 = lVar23 + -1;
                          } while (lVar23 != 0);
                        }
                      }
                      else {
                        pFVar25 = pFVar5 + lVar23;
                        lVar23 = (iVar22 - lVar23) + 1;
                        if ((uVar1 & 1) == 0) {
                          do {
                            if ((iVar20 < 0) || (pFVar25->x < lVar12)) {
                              lVar12 = pFVar25->x;
                              iVar20 = iVar21;
                            }
                            iVar21 = iVar21 + 1;
                            pFVar25 = pFVar25 + 1;
                            lVar23 = lVar23 + -1;
                          } while (lVar23 != 0);
                        }
                        else {
                          do {
                            if ((iVar20 < 0) || (lVar12 < pFVar25->x)) {
                              lVar12 = pFVar25->x;
                              iVar20 = iVar21;
                            }
                            iVar21 = iVar21 + 1;
                            pFVar25 = pFVar25 + 1;
                            lVar23 = lVar23 + -1;
                          } while (lVar23 != 0);
                        }
                      }
                    }
                    iVar21 = iVar22 + 1;
                    lVar19 = lVar19 + 1;
                  } while (lVar19 != lVar14);
                }
                metrics = local_3a8;
                face = local_3a0;
                if (bVar6) {
                  alStack_1c8[uVar16] = lVar12;
                  uVar16 = (ulong)((int)uVar16 + 1);
                }
                else {
                  alStack_368[local_3b8] = lVar12;
                  local_3b8 = (ulong)((int)local_3b8 + 1);
                }
              }
            }
            uVar15 = (uint)uVar16;
          } while (*p != '\0');
        }
        if ((uint)local_3b8 != 0 || uVar15 != 0) {
          if (1 < uVar15) {
            uVar9 = 1;
            do {
              uVar16 = (ulong)uVar9;
              do {
                lVar14 = alStack_1c8[uVar16];
                uVar13 = (ulong)((int)uVar16 - 1);
                if (alStack_1c8[uVar13] <= lVar14) break;
                alStack_1c8[uVar16] = alStack_1c8[uVar13];
                alStack_1c8[uVar13] = lVar14;
                uVar16 = uVar13;
              } while (uVar13 != 0);
              uVar9 = uVar9 + 1;
            } while (uVar9 != uVar15);
          }
          if (1 < (uint)local_3b8) {
            uVar9 = 1;
            do {
              uVar16 = (ulong)uVar9;
              do {
                lVar14 = alStack_368[uVar16];
                uVar13 = (ulong)((int)uVar16 - 1);
                if (alStack_368[uVar13] <= lVar14) break;
                alStack_368[uVar16] = alStack_368[uVar13];
                alStack_368[uVar13] = lVar14;
                uVar16 = uVar13;
              } while (uVar13 != 0);
              uVar9 = uVar9 + 1;
            } while (uVar9 != (uint)local_3b8);
          }
          uVar9 = local_380->blue_count;
          pAVar10 = local_380->blues + uVar9;
          local_380->blue_count = uVar9 + 1;
          if ((uint)local_3b8 == 0) {
            lVar14 = alStack_1c8[uVar15 >> 1];
LAB_0026a6f2:
            local_380->blues[uVar9].shoot.org = lVar14;
            (pAVar10->ref).org = lVar14;
          }
          else {
            if (uVar15 == 0) {
              lVar14 = alStack_368[(uint)local_3b8 >> 1];
              goto LAB_0026a6f2;
            }
            (pAVar10->ref).org = alStack_1c8[uVar15 >> 1];
            local_380->blues[uVar9].shoot.org = alStack_368[(uint)local_3b8 >> 1];
          }
          lVar14 = (pAVar10->ref).org;
          lVar12 = local_380->blues[uVar9].shoot.org;
          uVar18 = (undefined7)((ulong)local_380 >> 8);
          face_00 = (AF_CJKMetrics)CONCAT71(uVar18,lVar14 <= lVar12);
          if ((lVar12 != lVar14) &&
             (bVar17 = lVar14 <= lVar12 ^ (byte)uVar1,
             face_00 = (AF_CJKMetrics)CONCAT71(uVar18,bVar17), (bVar17 & 1) == 0)) {
            lVar14 = (lVar14 + lVar12) / 2;
            local_380->blues[uVar9].shoot.org = lVar14;
            (pAVar10->ref).org = lVar14;
          }
          local_380->blues[uVar9].flags = (uint)uVar1 * 2 & 2;
        }
        AVar8 = local_378[1].string;
        pAVar11 = local_378 + 1;
      } while (AVar8 != AF_BLUE_STRING_MAX);
    }
    af_cjk_metrics_check_digits(metrics,(FT_Face)face_00);
  }
  face->charmap = local_398;
  return 0;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  af_cjk_metrics_init( AF_CJKMetrics  metrics,
                       FT_Face        face )
  {
    FT_CharMap  oldmap = face->charmap;


    metrics->units_per_em = face->units_per_EM;

    if ( !FT_Select_Charmap( face, FT_ENCODING_UNICODE ) )
    {
      af_cjk_metrics_init_widths( metrics, face );
      af_cjk_metrics_init_blues( metrics, face );
      af_cjk_metrics_check_digits( metrics, face );
    }

    face->charmap = oldmap;
    return FT_Err_Ok;
  }